

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O2

gs_val_t * gs_val_default(gs_val_t *__return_storage_ptr__,gs_val_type type)

{
  vec2 vVar1;
  vec3 vVar2;
  
  switch(type) {
  default:
    __return_storage_ptr__->type = GS_VAL_VOID;
    __return_storage_ptr__->is_return = false;
    break;
  case GS_VAL_BOOL:
    __return_storage_ptr__->type = GS_VAL_BOOL;
    __return_storage_ptr__->is_return = false;
    (__return_storage_ptr__->field_2).bool_val = false;
    break;
  case GS_VAL_INT:
    __return_storage_ptr__->type = GS_VAL_INT;
    goto LAB_00133f03;
  case GS_VAL_FLOAT:
    __return_storage_ptr__->type = GS_VAL_FLOAT;
LAB_00133f03:
    __return_storage_ptr__->is_return = false;
    (__return_storage_ptr__->field_2).int_val = 0;
    break;
  case GS_VAL_VEC2:
    vVar1 = vec2_create(0.0,0.0);
    __return_storage_ptr__->type = GS_VAL_VEC2;
    __return_storage_ptr__->is_return = false;
    (__return_storage_ptr__->field_2).vec2_val = vVar1;
    break;
  case GS_VAL_VEC3:
    vVar2 = vec3_create(0.0,0.0,0.0);
    __return_storage_ptr__->type = GS_VAL_VEC3;
    __return_storage_ptr__->is_return = false;
    (__return_storage_ptr__->field_2).vec3_val = vVar2;
    break;
  case GS_VAL_LIST:
    __return_storage_ptr__->type = GS_VAL_LIST;
    goto LAB_00133f4e;
  case GS_VAL_STRING:
    __return_storage_ptr__->type = GS_VAL_STRING;
LAB_00133f4e:
    __return_storage_ptr__->is_return = false;
    (__return_storage_ptr__->field_2).list_val = (vec_gs_val_t *)0x0;
    break;
  case GS_VAL_FN:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/common/script.c"
                  ,0xa48,"gs_val_t gs_val_default(gs_val_type)");
  case GS_VAL_C_FN:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/common/script.c"
                  ,0xa4b,"gs_val_t gs_val_default(gs_val_type)");
  case GS_VAL_ERROR:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/common/script.c"
                  ,0xa4e,"gs_val_t gs_val_default(gs_val_type)");
  case GS_VAL_NUM_TYPES:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/common/script.c"
                  ,0xa51,"gs_val_t gs_val_default(gs_val_type)");
  }
  return __return_storage_ptr__;
}

Assistant:

gs_val_t gs_val_default(gs_val_type type) {
    switch (type) {
        case GS_VAL_VOID:
            return gs_val_void();
        case GS_VAL_BOOL:
            return gs_val_bool(false);
        case GS_VAL_INT:
            return gs_val_int(0);
        case GS_VAL_FLOAT:
            return gs_val_float(0);
        case GS_VAL_VEC2:
            return gs_val_vec2(V2(0, 0));
        case GS_VAL_VEC3:
            return gs_val_vec3(V3(0, 0, 0));
        case GS_VAL_LIST:
            return gs_val_list(NULL);
        case GS_VAL_STRING:
            return gs_val_string(NULL);
        case GS_VAL_FN:
            assert(false);
            break;
        case GS_VAL_C_FN:
            assert(false);
            break;
        case GS_VAL_ERROR:
            assert(false);
            break;
        case GS_VAL_NUM_TYPES:
            assert(false);
            break;
    }
    return gs_val_void();
}